

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bossac.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _func_int **pp_Var1;
  char cVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  socklen_t sVar6;
  BossaObserver *__n;
  FILE *pFVar7;
  uint uVar8;
  pointer *__ptr;
  size_t in_R9;
  char *pcVar9;
  float fVar10;
  undefined1 local_1a8 [20];
  uint32_t totalErrors;
  Flasher flasher;
  Device device;
  Samba samba;
  PortFactory portFactory;
  CmdOpts cmd;
  FlasherInfo info;
  BossaObserver observer;
  
  sVar6 = 0x13;
  CmdOpts::CmdOpts(&cmd,argc,argv,0x13,opts);
  pcVar9 = *argv;
  pcVar5 = strrchr(pcVar9,0x2f);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = strrchr(pcVar9,0x5c);
    if (pcVar5 != (char *)0x0) goto LAB_00105822;
  }
  else {
LAB_00105822:
    pcVar9 = pcVar5 + 1;
    *argv = pcVar9;
  }
  if (argc < 2) {
    pcVar5 = "%s: you must specify at least one option\n";
LAB_00105e29:
    fprintf(_stderr,pcVar5,pcVar9);
  }
  else {
    uVar3 = CmdOpts::parse(&cmd);
    if (-1 < (int)uVar3) {
      if (config.read == true) {
        if ((config.write != false) || (config.verify == true)) {
          pcVar9 = *argv;
          pcVar5 = "%s: read option is exclusive of write or verify\n";
          goto LAB_00105e29;
        }
LAB_00105892:
        if (uVar3 == argc) {
          pcVar9 = *argv;
          pcVar5 = "%s: missing file\n";
          goto LAB_00105e29;
        }
        argc = argc - 1;
      }
      else if ((config.write != false) || (config.verify == true)) goto LAB_00105892;
      if (uVar3 != argc) {
        pcVar9 = *argv;
        pcVar5 = "%s: extra arguments found\n";
        goto LAB_00105e29;
      }
      if (config.help == false) {
        if (config.version == false) {
          Samba::Samba(&samba);
          LinuxPortFactory::LinuxPortFactory(&portFactory);
          if (config.debug == true) {
            samba._debug = true;
          }
          if (config.port == false) {
            LinuxPortFactory::def_abi_cxx11_((string *)&info,&portFactory);
            std::__cxx11::string::operator=((string *)&config.portArg,(string *)&info);
            std::__cxx11::string::~string((string *)&info);
          }
          if (config.arduinoErase == true) {
            LinuxPortFactory::create((LinuxPortFactory *)&info,(string *)&portFactory,true);
            pp_Var1 = info._vptr_FlasherInfo;
            sVar6 = 0;
            cVar2 = (**(code **)(*info._vptr_FlasherInfo + 0x10))
                              (info._vptr_FlasherInfo,0x4b0,8,0,0);
            if (cVar2 == '\0') {
              pFVar7 = _stderr;
              fwrite("Failed to open port at 1200bps\n",0x1f,1,_stderr);
              sVar6 = (socklen_t)pFVar7;
            }
            else {
              (**(code **)(*pp_Var1 + 0x60))(pp_Var1,1);
              (**(code **)(*pp_Var1 + 0x58))(pp_Var1,0);
              (**(code **)(*pp_Var1 + 0x18))(pp_Var1);
            }
            uVar8 = (uint)(cVar2 == '\0');
            (**(code **)(*pp_Var1 + 8))(pp_Var1);
            if (cVar2 != '\0') goto LAB_00105a1b;
          }
          else {
LAB_00105a1b:
            if (config.portArg._M_string_length == 0) {
              fwrite("No serial ports available\n",0x1a,1,_stderr);
            }
            else {
              if (config.usbPort == true) {
                sVar6 = (socklen_t)config.usbPortArg;
                LinuxPortFactory::create
                          ((LinuxPortFactory *)(local_1a8 + 8),(string *)&portFactory,true);
                iVar4 = Samba::connect(&samba,(int)local_1a8 + 8,(sockaddr *)0x1c200,sVar6);
                cVar2 = (char)iVar4;
                if ((long *)local_1a8._8_8_ != (long *)0x0) {
                  (**(code **)(*(long *)local_1a8._8_8_ + 8))();
                }
                local_1a8._8_8_ = (long *)0x0;
              }
              else {
                LinuxPortFactory::create((LinuxPortFactory *)local_1a8,(string *)&portFactory);
                iVar4 = Samba::connect(&samba,(int)local_1a8,(sockaddr *)0x1c200,sVar6);
                cVar2 = (char)iVar4;
                if ((_func_int **)local_1a8._0_8_ != (_func_int **)0x0) {
                  (**(code **)(*(_func_int **)local_1a8._0_8_ + 8))();
                }
                local_1a8._0_8_ = (_func_int **)0x0;
              }
              if (cVar2 != '\0') {
                device._vptr_Device = (_func_int **)&PTR__Device_00117088;
                device._flash._M_t.super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                super__Head_base<0UL,_Flash_*,_false>._M_head_impl =
                     (__uniq_ptr_data<Flash,_std::default_delete<Flash>,_true,_true>)
                     (__uniq_ptr_impl<Flash,_std::default_delete<Flash>_>)0x0;
                device._family = FAMILY_NONE;
                device._samba = &samba;
                Device::create(&device);
                flasher._observer = &observer.super_FlasherObserver;
                observer.super_FlasherObserver._vptr_FlasherObserver =
                     (_func_int **)&PTR__FlasherObserver_00117020;
                observer._lastTicks = -1;
                flasher._flash = &device._flash;
                flasher._vptr_Flasher = (_func_int **)&PTR__Flasher_001170b8;
                __n = (BossaObserver *)flasher._observer;
                flasher._samba = &samba;
                if (config.info == true) {
                  info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
                  info._vptr_FlasherInfo = (_func_int **)&PTR__FlasherInfo_001170e8;
                  info.name._M_string_length = 0;
                  info.name.field_2._M_local_buf[0] = '\0';
                  __n = (BossaObserver *)&info.version.field_2;
                  info.version._M_string_length = 0;
                  info.version.field_2._M_local_buf[0] = '\0';
                  info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0
                  ;
                  info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
                  info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                       (_Bit_type *)0x0;
                  info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
                  info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
                  info.version._M_dataplus._M_p = (pointer)__n;
                  Flasher::info(&flasher,&info);
                  FlasherInfo::print(&info);
                  FlasherInfo::~FlasherInfo(&info);
                }
                if (config.unlock == true) {
                  Flasher::lock(&flasher,&config.unlockArg,false);
                }
                if (config.erase == true) {
                  timer_start();
                  Flasher::erase(&flasher,config.offsetArg);
                  fVar10 = timer_stop();
                  printf("\nDone in %5.3f seconds\n",(double)fVar10);
                }
                if (config.write == true) {
                  timer_start();
                  Flasher::write(&flasher,(int)argv[uVar3],(void *)(ulong)(uint)config.offsetArg,
                                 (size_t)__n);
                  fVar10 = timer_stop();
                  printf("\nDone in %5.3f seconds\n",(double)fVar10);
                }
                if (config.verify == true) {
                  timer_start();
                  iVar4 = Flasher::verify(&flasher,(EVP_PKEY_CTX *)argv[uVar3],(uchar *)&info,
                                          (size_t)&totalErrors,
                                          (uchar *)(ulong)(uint)config.offsetArg,in_R9);
                  if ((char)iVar4 != '\0') {
                    fVar10 = timer_stop();
                    printf("\nVerify successful\nDone in %5.3f seconds\n",(double)fVar10);
                    goto LAB_00105c8f;
                  }
                  printf("\nVerify failed\nPage errors: %d\nByte errors: %d\n",
                         (ulong)info._vptr_FlasherInfo & 0xffffffff,(ulong)totalErrors);
                  uVar8 = 2;
                }
                else {
LAB_00105c8f:
                  if (config.read == true) {
                    timer_start();
                    Flasher::read(&flasher,(int)argv[uVar3],(void *)(ulong)(uint)config.readArg,
                                  (ulong)(uint)config.offsetArg);
                    fVar10 = timer_stop();
                    printf("\nDone in %5.3f seconds\n",(double)fVar10);
                  }
                  pcVar9 = "true";
                  if (config.boot == true) {
                    pcVar5 = "true";
                    if (config.bootArg == 0) {
                      pcVar5 = "false";
                    }
                    printf("Set boot flash %s\n",pcVar5);
                    (**(code **)(*(long *)device._flash._M_t.
                                          super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>
                                          .super__Head_base<0UL,_Flash_*,_false>._M_head_impl + 0xa8
                                ))(device._flash._M_t.
                                   super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                                   super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                                   super__Head_base<0UL,_Flash_*,_false>._M_head_impl,
                                   config.bootArg != 0);
                  }
                  if (config.bod == true) {
                    pcVar5 = "true";
                    if (config.bodArg == 0) {
                      pcVar5 = "false";
                    }
                    printf("Set brownout detect %s\n",pcVar5);
                    (**(code **)(*(long *)device._flash._M_t.
                                          super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>
                                          .super__Head_base<0UL,_Flash_*,_false>._M_head_impl + 0x78
                                ))(device._flash._M_t.
                                   super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                                   super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                                   super__Head_base<0UL,_Flash_*,_false>._M_head_impl,
                                   config.bodArg != 0);
                  }
                  if (config.bor == true) {
                    if (config.borArg == 0) {
                      pcVar9 = "false";
                    }
                    printf("Set brownout reset %s\n",pcVar9);
                    (**(code **)(*(long *)device._flash._M_t.
                                          super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>
                                          .super__Head_base<0UL,_Flash_*,_false>._M_head_impl + 0x90
                                ))(device._flash._M_t.
                                   super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
                                   super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
                                   super__Head_base<0UL,_Flash_*,_false>._M_head_impl,
                                   config.borArg != 0);
                  }
                  if (config.security == true) {
                    puts("Set security");
                    (**(code **)(*(long *)device._flash._M_t.
                                          super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>
                                          .super__Head_base<0UL,_Flash_*,_false>._M_head_impl + 0x68
                                ))();
                  }
                  if (config.lock == true) {
                    Flasher::lock(&flasher,&config.lockArg,true);
                  }
                  (**(code **)(*(long *)device._flash._M_t.
                                        super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>
                                        .super__Head_base<0UL,_Flash_*,_false>._M_head_impl + 0xb8))
                            ();
                  uVar8 = 0;
                  if (config.reset == true) {
                    Device::reset(&device);
                  }
                }
                Device::~Device(&device);
                goto LAB_00105e80;
              }
              fprintf(_stderr,"No device found on %s\n",config.portArg._M_dataplus._M_p);
            }
            uVar8 = 1;
          }
LAB_00105e80:
          LinuxPortFactory::~LinuxPortFactory(&portFactory);
          Samba::~Samba(&samba);
          goto LAB_00105e38;
        }
      }
      else {
        printf("Usage: %s [OPTION...] [FILE]\n",*argv);
      }
      puts(
          "Basic Open Source SAM-BA Application (BOSSA) Version \nFlash programmer for Atmel SAM devices.\nCopyright (c) 2011-2018 ShumaTech (http://www.shumatech.com)"
          );
      uVar8 = 0;
      if (config.help == true) {
        puts(
            "\nExamples:\n  bossac -e -w -v -b image.bin   # Erase flash, write flash with image.bin,\n                                 # verify the write, and set boot from flash\n  bossac -r0x10000 image.bin     # Read 64KB from flash and store in image.bin"
            );
        puts("\nOptions:");
        CmdOpts::usage(&cmd,_stdout);
        puts("\nReport bugs to <bugs@shumatech.com>");
        uVar8 = 0;
      }
      goto LAB_00105e38;
    }
  }
  help(*argv);
  uVar8 = 1;
LAB_00105e38:
  CmdOpts::~CmdOpts(&cmd);
  return uVar8;
}

Assistant:

int
main(int argc, char* argv[])
{
    int args;
    char* pos;
    CmdOpts cmd(argc, argv, sizeof(opts) / sizeof(opts[0]), opts);

    if ((pos = strrchr(argv[0], '/')) || (pos = strrchr(argv[0], '\\')))
        argv[0] = pos + 1;

    if (argc <= 1)
    {
        fprintf(stderr, "%s: you must specify at least one option\n", argv[0]);
        return help(argv[0]);
    }

    args = cmd.parse();
    if (args < 0)
        return help(argv[0]);

    if (config.read && (config.write || config.verify))
    {
        fprintf(stderr, "%s: read option is exclusive of write or verify\n", argv[0]);
        return help(argv[0]);
    }

    if (config.read || config.write || config.verify)
    {
        if (args == argc)
        {
            fprintf(stderr, "%s: missing file\n", argv[0]);
            return help(argv[0]);
        }
        argc--;
    }
    if (args != argc)
    {
        fprintf(stderr, "%s: extra arguments found\n", argv[0]);
        return help(argv[0]);
    }

    if (config.help || config.version)
    {
        if (config.help)
            printf("Usage: %s [OPTION...] [FILE]\n", argv[0]);
        printf("Basic Open Source SAM-BA Application (BOSSA) Version \n"
               "Flash programmer for Atmel SAM devices.\n"
               "Copyright (c) 2011-2018 ShumaTech (http://www.shumatech.com)\n"
              );
        if (config.help)
        {
            printf("\n"
                   "Examples:\n"
                   "  bossac -e -w -v -b image.bin   # Erase flash, write flash with image.bin,\n"
                   "                                 # verify the write, and set boot from flash\n"
                   "  bossac -r0x10000 image.bin     # Read 64KB from flash and store in image.bin\n"
                  );
            printf("\nOptions:\n");
            cmd.usage(stdout);
            printf("\nReport bugs to <bugs@shumatech.com>\n");
        }
        return 0;
    }

    try
    {
        Samba samba;
        PortFactory portFactory;

        if (config.debug)
            samba.setDebug(true);

        if (!config.port)
            config.portArg = portFactory.def();

        if (config.arduinoErase)
        {
            SerialPort::Ptr port;
            port = portFactory.create(config.portArg, config.usbPortArg != 0);

            if(!port->open(1200))
            {
                fprintf(stderr, "Failed to open port at 1200bps\n");
                return 1;
            }

            port->setRTS(true);
            port->setDTR(false);
            port->close();
        }

        if (config.portArg.empty())
        {
            fprintf(stderr, "No serial ports available\n");
            return 1;
        }

        bool res;
        if (config.usbPort)
            res = samba.connect(portFactory.create(config.portArg, config.usbPortArg != 0));
        else
            res = samba.connect(portFactory.create(config.portArg));
        if (!res)
        {
            fprintf(stderr, "No device found on %s\n", config.portArg.c_str());
            return 1;
        }

        Device device(samba);
        device.create();

        Device::FlashPtr& flash = device.getFlash();

        BossaObserver observer;
        Flasher flasher(samba, device, observer);

        if (config.info)
        {
            FlasherInfo info;
            flasher.info(info);
            info.print();
        }

        if (config.unlock)
            flasher.lock(config.unlockArg, false);

        if (config.erase)
        {
            timer_start();
            flasher.erase(config.offsetArg);
            printf("\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.write)
        {
            timer_start();
            flasher.write(argv[args], config.offsetArg);
            printf("\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.verify)
        {
            uint32_t pageErrors;
            uint32_t totalErrors;

            timer_start();
            if (!flasher.verify(argv[args], pageErrors, totalErrors, config.offsetArg))
            {
                printf("\nVerify failed\nPage errors: %d\nByte errors: %d\n",
                    pageErrors, totalErrors);
                return 2;
            }

            printf("\nVerify successful\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.read)
        {
            timer_start();
            flasher.read(argv[args], config.readArg, config.offsetArg);
            printf("\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.boot)
        {
            printf("Set boot flash %s\n", config.bootArg ? "true" : "false");
            flash->setBootFlash(config.bootArg);
        }

        if (config.bod)
        {
            printf("Set brownout detect %s\n", config.bodArg ? "true" : "false");
            flash->setBod(config.bodArg);
        }

        if (config.bor)
        {
            printf("Set brownout reset %s\n", config.borArg ? "true" : "false");
            flash->setBor(config.borArg);
        }

        if (config.security)
        {
            printf("Set security\n");
            flash->setSecurity();
        }

        if (config.lock)
            flasher.lock(config.lockArg, true);

        flash->writeOptions();

        if (config.reset)
            device.reset();
    }
    catch (exception& e)
    {
        fprintf(stderr, "\n%s\n", e.what());
        return 1;
    }
    catch(...)
    {
        fprintf(stderr, "\nUnhandled exception\n");
        return 1;
    }

    return 0;
}